

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O1

duckdb_state
duckdb::deprecated_duckdb_translate_column
          (MaterializedQueryResult *result,duckdb_column *column,idx_t col)

{
  PhysicalType PVar1;
  size_t __size;
  unsigned_long *puVar2;
  bool bVar3;
  ColumnDataCollection *this;
  bool *__s;
  idx_t iVar4;
  void *pvVar5;
  DataChunk *this_00;
  reference pvVar6;
  reference pvVar7;
  runtime_error *this_01;
  PhysicalType type;
  long lVar8;
  duckdb_state dVar9;
  vector<duckdb::LogicalType,_true> *this_02;
  ulong uVar10;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_true> column_ids;
  ColumnDataChunkIterator __end2;
  ColumnDataChunkIterator __begin2;
  vector<unsigned_long,_true> local_1d0;
  ColumnDataCollection *local_1b8;
  MaterializedQueryResult *local_1b0;
  vector<unsigned_long,_true> local_1a8;
  ColumnDataChunkIterationHelper local_190;
  ColumnDataChunkIterator local_170;
  ColumnDataChunkIterator local_d0;
  
  local_1b8 = (ColumnDataCollection *)col;
  local_1b0 = result;
  this = MaterializedQueryResult::Collection(result);
  __size = this->count;
  __s = (bool *)malloc(__size);
  column->deprecated_nullmask = __s;
  iVar4 = GetCTypeSize(column->deprecated_type);
  if (iVar4 == 0) {
    if (__size == 0) {
      return DuckDBSuccess;
    }
    switchD_0105b559::default(__s,0,__size);
    return DuckDBSuccess;
  }
  pvVar5 = malloc(iVar4 * __size);
  column->deprecated_data = pvVar5;
  if (__s == (bool *)0x0) {
    return DuckDBError;
  }
  if (pvVar5 == (void *)0x0) {
    return DuckDBError;
  }
  local_d0.collection = local_1b8;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d0,__l,
             (allocator_type *)&local_170);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d0);
  ColumnDataCollection::Chunks(&local_190,this,&local_1a8);
  if (local_1a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ColumnDataChunkIterationHelper::begin(&local_d0,&local_190);
  ColumnDataChunkIterationHelper::end(&local_170,&local_190);
  lVar8 = 0;
  while (bVar3 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                           (&local_d0,&local_170), bVar3) {
    this_00 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_d0);
    if (this_00->count != 0) {
      uVar10 = 0;
      do {
        pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
        puVar2 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar3 = false;
        }
        else {
          bVar3 = (puVar2[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0;
        }
        column->deprecated_nullmask[uVar10 + lVar8] = bVar3;
        uVar10 = uVar10 + 1;
      } while (uVar10 < this_00->count);
      lVar8 = lVar8 + uVar10;
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_d0);
  }
  if (local_170.scan_chunk.internal.
      super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.scan_chunk.internal.
               super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.scan_state.column_ids.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_170.scan_state);
  if (local_d0.scan_chunk.internal.super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.scan_chunk.internal.
               super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.scan_state.column_ids.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_d0.scan_state);
  if (local_190.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                    .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this_02 = &(local_1b0->super_QueryResult).super_BaseQueryResult.types;
  pvVar7 = vector<duckdb::LogicalType,_true>::operator[](this_02,(size_type)local_1b8);
  dVar9 = DuckDBError;
  switch(pvVar7->id_) {
  case BOOLEAN:
    WriteData<bool,bool,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case TINYINT:
    WriteData<signed_char,signed_char,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case SMALLINT:
    WriteData<short,short,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case INTEGER:
    WriteData<int,int,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case BIGINT:
    WriteData<long,long,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case DATE:
    WriteData<duckdb::date_t,duckdb::date_t,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case TIME:
    WriteData<duckdb::dtime_t,duckdb::dtime_t,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case TIMESTAMP_SEC:
    WriteData<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CTimestampSecConverter>
              (column,this,&local_1d0);
    break;
  case TIMESTAMP_MS:
    WriteData<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CTimestampMsConverter>
              (column,this,&local_1d0);
    break;
  case TIMESTAMP:
  case TIMESTAMP_TZ:
    WriteData<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CStandardConverter>
              (column,this,&local_1d0);
    break;
  case TIMESTAMP_NS:
    WriteData<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CTimestampNsConverter>
              (column,this,&local_1d0);
    break;
  case DECIMAL:
    pvVar7 = vector<duckdb::LogicalType,_true>::operator[](this_02,(size_type)local_1b8);
    PVar1 = pvVar7->physical_type_;
    if (PVar1 < INT64) {
      if (PVar1 == INT16) {
        WriteData<short,duckdb_hugeint,duckdb::CDecimalConverter<short>>(column,this,&local_1d0);
      }
      else {
        if (PVar1 != INT32) {
LAB_0172cfd5:
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          pvVar7 = vector<duckdb::LogicalType,_true>::operator[](this_02,(size_type)local_1b8);
          TypeIdToString_abi_cxx11_
                    ((string *)&local_170,(duckdb *)(ulong)pvVar7->physical_type_,type);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_d0,"Unsupported physical type for Decimal",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_170);
          ::std::runtime_error::runtime_error(this_01,(string *)&local_d0);
          __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        WriteData<int,duckdb_hugeint,duckdb::CDecimalConverter<int>>(column,this,&local_1d0);
      }
    }
    else {
      if (PVar1 != INT64) {
        if (PVar1 != INT128) goto LAB_0172cfd5;
        goto switchD_0172cd57_caseD_32;
      }
      WriteData<long,duckdb_hugeint,duckdb::CDecimalConverter<long>>(column,this,&local_1d0);
    }
    break;
  case FLOAT:
    WriteData<float,float,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case DOUBLE:
    WriteData<double,double,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  default:
    goto switchD_0172cd57_caseD_18;
  case VARCHAR:
    WriteData<duckdb::string_t,char_const*,duckdb::CStringConverter>(column,this,&local_1d0);
    break;
  case BLOB:
    WriteData<duckdb::string_t,duckdb_blob,duckdb::CBlobConverter>(column,this,&local_1d0);
    break;
  case INTERVAL:
    WriteData<duckdb::interval_t,duckdb_interval,duckdb::CIntervalConverter>(column,this,&local_1d0)
    ;
    break;
  case UTINYINT:
    WriteData<unsigned_char,unsigned_char,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case USMALLINT:
    WriteData<unsigned_short,unsigned_short,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case UINTEGER:
    WriteData<unsigned_int,unsigned_int,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case UBIGINT:
    WriteData<unsigned_long,unsigned_long,duckdb::CStandardConverter>(column,this,&local_1d0);
    break;
  case TIME_TZ:
    WriteData<duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::CStandardConverter>
              (column,this,&local_1d0);
    break;
  case UHUGEINT:
    WriteData<duckdb::uhugeint_t,duckdb_uhugeint,duckdb::CUhugeintConverter>(column,this,&local_1d0)
    ;
    break;
  case HUGEINT:
switchD_0172cd57_caseD_32:
    WriteData<duckdb::hugeint_t,duckdb_hugeint,duckdb::CHugeintConverter>(column,this,&local_1d0);
  }
  dVar9 = DuckDBSuccess;
switchD_0172cd57_caseD_18:
  if (local_1d0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar9;
}

Assistant:

duckdb_state deprecated_duckdb_translate_column(MaterializedQueryResult &result, duckdb_column *column, idx_t col) {
	D_ASSERT(!result.HasError());
	auto &collection = result.Collection();
	idx_t row_count = collection.Count();
	column->deprecated_nullmask = (bool *)duckdb_malloc(sizeof(bool) * collection.Count());

	auto type_size = GetCTypeSize(column->deprecated_type);
	if (type_size == 0) {
		for (idx_t row_id = 0; row_id < row_count; row_id++) {
			column->deprecated_nullmask[row_id] = false;
		}
		// Unsupported type, e.g., a LIST. By returning DuckDBSuccess here,
		// we allow filling other columns, and return NULL for all unsupported types.
		return DuckDBSuccess;
	}

	column->deprecated_data = duckdb_malloc(type_size * row_count);
	if (!column->deprecated_nullmask || !column->deprecated_data) { // LCOV_EXCL_START
		// malloc failure
		return DuckDBError;
	} // LCOV_EXCL_STOP

	vector<column_t> column_ids {col};
	// first convert the nullmask
	{
		idx_t row = 0;
		for (auto &input : collection.Chunks(column_ids)) {
			for (idx_t k = 0; k < input.size(); k++) {
				column->deprecated_nullmask[row++] = FlatVector::IsNull(input.data[0], k);
			}
		}
	}
	// then write the data
	switch (result.types[col].id()) {
	case LogicalTypeId::BOOLEAN:
		WriteData<bool>(column, collection, column_ids);
		break;
	case LogicalTypeId::TINYINT:
		WriteData<int8_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::SMALLINT:
		WriteData<int16_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::INTEGER:
		WriteData<int32_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::BIGINT:
		WriteData<int64_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::UTINYINT:
		WriteData<uint8_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::USMALLINT:
		WriteData<uint16_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::UINTEGER:
		WriteData<uint32_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::UBIGINT:
		WriteData<uint64_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::FLOAT:
		WriteData<float>(column, collection, column_ids);
		break;
	case LogicalTypeId::DOUBLE:
		WriteData<double>(column, collection, column_ids);
		break;
	case LogicalTypeId::DATE:
		WriteData<date_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::TIME:
		WriteData<dtime_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::TIME_TZ:
		WriteData<dtime_tz_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		WriteData<timestamp_t>(column, collection, column_ids);
		break;
	case LogicalTypeId::VARCHAR: {
		WriteData<string_t, const char *, CStringConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::BLOB: {
		WriteData<string_t, duckdb_blob, CBlobConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		WriteData<timestamp_t, timestamp_t, CTimestampNsConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::TIMESTAMP_MS: {
		WriteData<timestamp_t, timestamp_t, CTimestampMsConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::TIMESTAMP_SEC: {
		WriteData<timestamp_t, timestamp_t, CTimestampSecConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::HUGEINT: {
		WriteData<hugeint_t, duckdb_hugeint, CHugeintConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::UHUGEINT: {
		WriteData<uhugeint_t, duckdb_uhugeint, CUhugeintConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::INTERVAL: {
		WriteData<interval_t, duckdb_interval, CIntervalConverter>(column, collection, column_ids);
		break;
	}
	case LogicalTypeId::DECIMAL: {
		// get data
		switch (result.types[col].InternalType()) {
		case PhysicalType::INT16: {
			WriteData<int16_t, duckdb_hugeint, CDecimalConverter<int16_t>>(column, collection, column_ids);
			break;
		}
		case PhysicalType::INT32: {
			WriteData<int32_t, duckdb_hugeint, CDecimalConverter<int32_t>>(column, collection, column_ids);
			break;
		}
		case PhysicalType::INT64: {
			WriteData<int64_t, duckdb_hugeint, CDecimalConverter<int64_t>>(column, collection, column_ids);
			break;
		}
		case PhysicalType::INT128: {
			WriteData<hugeint_t, duckdb_hugeint, CHugeintConverter>(column, collection, column_ids);
			break;
		}
		default:
			throw std::runtime_error("Unsupported physical type for Decimal" +
			                         TypeIdToString(result.types[col].InternalType()));
		}
		break;
	}
	default: // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP
	return DuckDBSuccess;
}